

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

UA_StatusCode
UA_Connection_completeMessages
          (UA_Connection *connection,UA_ByteString *message,UA_Boolean *realloced)

{
  uint uVar1;
  bool bVar2;
  int3 iVar3;
  ulong uVar4;
  UA_StatusCode UVar5;
  UA_Byte *pUVar6;
  ulong length;
  ulong uVar7;
  size_t __size;
  size_t sVar8;
  bool bVar9;
  size_t local_50;
  size_t length_pos;
  UA_UInt32 local_3c;
  UA_ByteString *pUStack_38;
  UA_UInt32 chunk_length;
  
  pUStack_38 = &connection->incompleteMessage;
  sVar8 = (connection->incompleteMessage).length;
  if (sVar8 != 0) {
    __size = sVar8 + message->length;
    pUVar6 = (UA_Byte *)realloc((connection->incompleteMessage).data,__size);
    if (pUVar6 == (UA_Byte *)0x0) {
      UVar5 = 0x80030000;
      goto LAB_00112b15;
    }
    memcpy(pUVar6 + (connection->incompleteMessage).length,message->data,message->length);
    (*connection->releaseRecvBuffer)(connection,message);
    message->data = pUVar6;
    message->length = __size;
    *realloced = true;
    pUStack_38->length = 0;
    pUStack_38->data = (UA_Byte *)0x0;
  }
  length = message->length;
  uVar4 = 0;
  length_pos = (size_t)realloced;
  while( true ) {
    uVar7 = uVar4;
    bVar9 = length - uVar7 < 8;
    bVar2 = !bVar9;
    if ((bVar9) ||
       (((((iVar3 = CONCAT12(message->data[uVar7 + 2],*(undefined2 *)(message->data + uVar7)),
           iVar3 != 0x47534d && (iVar3 != 0x4b4341)) && (iVar3 != 0x4c4548)) &&
         ((iVar3 != 0x4e504f && (iVar3 != 0x525245)))) && (iVar3 != 0x4f4c43)))) goto LAB_00112ad8;
    local_3c = 0;
    local_50 = uVar7 + 4;
    UVar5 = UA_UInt32_decodeBinary(message,&local_50,&local_3c);
    if ((UVar5 != 0) || (local_3c < 0x10)) break;
    length = message->length;
    uVar1 = (connection->localConf).recvBufferSize;
    bVar2 = uVar1 < local_3c;
    if ((uVar1 < local_3c) || (uVar4 = local_3c + uVar7, length < local_3c + uVar7))
    goto LAB_00112ad8;
  }
  length = message->length;
  bVar2 = true;
LAB_00112ad8:
  realloced = (UA_Boolean *)length_pos;
  sVar8 = length - uVar7;
  if (sVar8 == 0) {
    return 0;
  }
  if (bVar2) {
    if (uVar7 != 0) {
      message->length = uVar7;
      return 0;
    }
    UVar5 = 0;
  }
  else if (uVar7 == 0) {
    if (*(char *)length_pos != '\0') {
      pUVar6 = message->data;
      pUStack_38->length = message->length;
      pUStack_38->data = pUVar6;
      message->length = 0;
      message->data = (UA_Byte *)0x0;
      return 0;
    }
    UVar5 = UA_ByteString_allocBuffer(pUStack_38,length);
    if (UVar5 == 0) {
      memcpy((connection->incompleteMessage).data,message->data,message->length);
      (*connection->releaseRecvBuffer)(connection,message);
      *realloced = true;
      return 0;
    }
  }
  else {
    UVar5 = UA_ByteString_allocBuffer(pUStack_38,sVar8);
    realloced = (UA_Boolean *)length_pos;
    if (UVar5 == 0) {
      memcpy((connection->incompleteMessage).data,message->data + uVar7,sVar8);
      message->length = uVar7;
      return 0;
    }
  }
LAB_00112b15:
  if (*realloced == false) {
    (*connection->releaseRecvBuffer)(connection,message);
  }
  UA_ByteString_deleteMembers(pUStack_38);
  return UVar5;
}

Assistant:

UA_StatusCode
UA_Connection_completeMessages(UA_Connection *connection, UA_ByteString *message,
                               UA_Boolean *realloced) {
    UA_StatusCode retval = UA_STATUSCODE_GOOD;

    /* We have a stored an incomplete chunk. Concat the received message to the end.
     * After this block, connection->incompleteMessage is always empty. */
    if(connection->incompleteMessage.length > 0) {
        size_t length = connection->incompleteMessage.length + message->length;
        UA_Byte *data = (UA_Byte*)UA_realloc(connection->incompleteMessage.data, length);
        if(!data) {
            retval = UA_STATUSCODE_BADOUTOFMEMORY;
            goto cleanup;
        }
        memcpy(&data[connection->incompleteMessage.length], message->data, message->length);
        connection->releaseRecvBuffer(connection, message);
        message->data = data;
        message->length = length;
        *realloced = true;
        connection->incompleteMessage = UA_BYTESTRING_NULL;
    }

    /* Loop over the chunks in the received buffer */
    size_t complete_until = 0; /* the received complete chunks end at this point */
    UA_Boolean garbage_end = false; /* garbage after the last complete message */
    while(message->length - complete_until >= 8) {
        /* Check the message type */
        UA_UInt32 msgtype = (UA_UInt32)message->data[complete_until] +
            ((UA_UInt32)message->data[complete_until+1] << 8) +
            ((UA_UInt32)message->data[complete_until+2] << 16);
        if(msgtype != ('M' + ('S' << 8) + ('G' << 16)) &&
           msgtype != ('E' + ('R' << 8) + ('R' << 16)) &&
           msgtype != ('O' + ('P' << 8) + ('N' << 16)) &&
           msgtype != ('H' + ('E' << 8) + ('L' << 16)) &&
           msgtype != ('A' + ('C' << 8) + ('K' << 16)) &&
           msgtype != ('C' + ('L' << 8) + ('O' << 16))) {
            garbage_end = true; /* the message type is not recognized */
            break;
        }

        /* Decode the length of the chunk */
        UA_UInt32 chunk_length = 0;
        size_t length_pos = complete_until + 4;
        UA_StatusCode decode_retval = UA_UInt32_decodeBinary(message, &length_pos, &chunk_length);

        /* The message size is not allowed. Throw the remaining bytestring away */
        if(decode_retval != UA_STATUSCODE_GOOD ||
           chunk_length < 16 ||
           chunk_length > connection->localConf.recvBufferSize) {
            garbage_end = true;
            break;
        }

        /* The chunk is okay but incomplete. Store the end. */
        if(chunk_length + complete_until > message->length)
            break;

        complete_until += chunk_length; /* Go to the next chunk */
    }

    /* Separate incomplete chunks */
    if(complete_until != message->length) {
        /* Garbage after the last good chunk. No need to keep a buffer */
        if(garbage_end) {
            if(complete_until == 0)
                goto cleanup; /* All garbage, only happens on messages from the network layer */
            message->length = complete_until;
            return UA_STATUSCODE_GOOD;
        }

        /* No good chunk, only an incomplete one */
        if(complete_until == 0) {
            if(!*realloced) {
                retval = UA_ByteString_allocBuffer(&connection->incompleteMessage, message->length);
                if(retval != UA_STATUSCODE_GOOD)
                    goto cleanup;
                memcpy(connection->incompleteMessage.data, message->data, message->length);
                connection->releaseRecvBuffer(connection, message);
                *realloced = true;
            } else {
                connection->incompleteMessage = *message;
                *message = UA_BYTESTRING_NULL;
            }
            return UA_STATUSCODE_GOOD;
        }

        /* At least one good chunk and an incomplete one */
        size_t incomplete_length = message->length - complete_until;
        retval = UA_ByteString_allocBuffer(&connection->incompleteMessage, incomplete_length);
        if(retval != UA_STATUSCODE_GOOD)
            goto cleanup;
        memcpy(connection->incompleteMessage.data,
               &message->data[complete_until], incomplete_length);
        message->length = complete_until;
    }

    return UA_STATUSCODE_GOOD;

 cleanup:
    if(!*realloced)
        connection->releaseRecvBuffer(connection, message);
    UA_ByteString_deleteMembers(&connection->incompleteMessage);
    return retval;
}